

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
        *this)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  
  if (this->size_ != 0) {
    if (this->capacity_ < 0x80) {
      if (this->capacity_ != 0) {
        sVar1 = this->capacity_;
        if (sVar1 != 0) {
          lVar2 = 0;
          sVar3 = 0;
          do {
            if (-1 < this->ctrl_[sVar3]) {
              cs_impl::any::recycle((any *)((long)&this->slots_->mDat + lVar2));
            }
            sVar3 = sVar3 + 1;
            sVar1 = this->capacity_;
            lVar2 = lVar2 + 8;
          } while (sVar3 != sVar1);
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,sVar1 + 0x10);
        this->ctrl_[sVar1] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>, phmap::Hash<cs_impl::any>, phmap::EqualTo<cs_impl::any>, std::allocator<cs_impl::any>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<cs_impl::any>, Hash = phmap::Hash<cs_impl::any>, Eq = phmap::EqualTo<cs_impl::any>, Alloc = std::allocator<cs_impl::any>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}